

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *__src;
  long lVar4;
  
  lVar4 = 0;
  __src = (byte *)0x0;
  do {
    bVar1 = *s;
    pbVar3 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[bVar1] & 1) == 0) {
      pbVar2 = (byte *)s + 2;
      do {
        pbVar3 = pbVar2;
        bVar1 = pbVar3[-1];
        if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) {
          pbVar3 = pbVar3 + -1;
          goto LAB_00113aa8;
        }
        bVar1 = *pbVar3;
        if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) goto LAB_00113aa8;
        bVar1 = pbVar3[1];
        if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) {
          pbVar3 = pbVar3 + 1;
          goto LAB_00113aa8;
        }
        bVar1 = pbVar3[2];
        pbVar2 = pbVar3 + 4;
      } while (((anonymous_namespace)::chartype_table[bVar1] & 1) == 0);
      pbVar3 = pbVar3 + 2;
    }
LAB_00113aa8:
    if (bVar1 == 0xd) {
      s = (char_t *)(pbVar3 + 1);
      *pbVar3 = 10;
      if (pbVar3[1] == 10) {
        if (__src != (byte *)0x0) {
          memmove(__src + -lVar4,__src,(long)s - (long)__src);
        }
        s = (char_t *)(pbVar3 + 2);
        lVar4 = lVar4 + 1;
        __src = (byte *)s;
      }
    }
    else {
      if (bVar1 == 0) {
        pbVar2 = pbVar3;
        if (__src != (byte *)0x0) {
          memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
          pbVar2 = pbVar3 + -lVar4;
        }
        *pbVar2 = 0;
        return (char_t *)pbVar3;
      }
      if (bVar1 == 0x3c) {
        pbVar2 = pbVar3;
        if (__src != (byte *)0x0) {
          memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
          pbVar2 = pbVar3 + -lVar4;
        }
        *pbVar2 = 0;
        return (char_t *)(pbVar3 + 1);
      }
      s = (char_t *)(pbVar3 + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}